

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O3

type __thiscall
llvm::yaml::
yamlize<std::vector<llvm::DWARFYAML::Abbrev,std::allocator<llvm::DWARFYAML::Abbrev>>,llvm::yaml::EmptyContext>
          (yaml *this,IO *io,
          vector<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_> *Seq,
          bool param_3,EmptyContext *Ctx)

{
  void *pvVar1;
  char cVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 local_40;
  void *SaveInfo;
  
  uVar3 = (**(code **)(*(long *)this + 0x18))();
  cVar2 = (**(code **)(*(long *)this + 0x10))(this);
  if (cVar2 != '\0') {
    uVar3 = (int)((ulong)((long)io->Ctxt - (long)io->_vptr_IO) >> 4) * -0x55555555;
  }
  SaveInfo = io;
  if (uVar3 != 0) {
    uVar6 = 0;
    do {
      cVar2 = (**(code **)(*(long *)this + 0x20))(this,uVar6 & 0xffffffff,&local_40);
      pvVar1 = SaveInfo;
      if (cVar2 != '\0') {
        lVar4 = *SaveInfo;
        uVar5 = (*(long *)((long)SaveInfo + 8) - lVar4 >> 4) * -0x5555555555555555;
        if (uVar5 < uVar6 || uVar5 - uVar6 == 0) {
          std::vector<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>::resize
                    ((vector<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_> *)
                     SaveInfo,uVar6 + 1);
          lVar4 = *pvVar1;
        }
        (**(code **)(*(long *)this + 0x68))(this);
        MappingTraits<llvm::DWARFYAML::Abbrev>::mapping((IO *)this,(Abbrev *)(uVar6 * 0x30 + lVar4))
        ;
        (**(code **)(*(long *)this + 0x70))(this);
        (**(code **)(*(long *)this + 0x28))(this,local_40);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar3);
  }
  (**(code **)(*(long *)this + 0x30))(this);
  return;
}

Assistant:

typename std::enable_if<has_SequenceTraits<T>::value, void>::type
yamlize(IO &io, T &Seq, bool, Context &Ctx) {
  if ( has_FlowTraits< SequenceTraits<T>>::value ) {
    unsigned incnt = io.beginFlowSequence();
    unsigned count = io.outputting() ? SequenceTraits<T>::size(io, Seq) : incnt;
    for(unsigned i=0; i < count; ++i) {
      void *SaveInfo;
      if ( io.preflightFlowElement(i, SaveInfo) ) {
        yamlize(io, SequenceTraits<T>::element(io, Seq, i), true, Ctx);
        io.postflightFlowElement(SaveInfo);
      }
    }
    io.endFlowSequence();
  }
  else {
    unsigned incnt = io.beginSequence();
    unsigned count = io.outputting() ? SequenceTraits<T>::size(io, Seq) : incnt;
    for(unsigned i=0; i < count; ++i) {
      void *SaveInfo;
      if ( io.preflightElement(i, SaveInfo) ) {
        yamlize(io, SequenceTraits<T>::element(io, Seq, i), true, Ctx);
        io.postflightElement(SaveInfo);
      }
    }
    io.endSequence();
  }
}